

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O1

void __thiscall tcu::ResultCollector::ResultCollector(ResultCollector *this)

{
  this->m_log = (TestLog *)0x0;
  (this->m_prefix)._M_dataplus._M_p = (pointer)&(this->m_prefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_prefix,0x1b3c1e9);
  this->m_result = QP_TEST_RESULT_LAST;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_message,"Pass","");
  return;
}

Assistant:

ResultCollector::ResultCollector (void)
	: m_log		(DE_NULL)
	, m_prefix	("")
	, m_result	(QP_TEST_RESULT_LAST)
	, m_message ("Pass")
{
}